

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_cankerworm(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *in_RDI;
  int dam;
  undefined1 in_stack_00001342;
  undefined1 in_stack_00001343;
  int in_stack_00001344;
  int in_stack_00001348;
  int in_stack_0000134c;
  CHAR_DATA *in_stack_00001350;
  CHAR_DATA *in_stack_00001358;
  int in_stack_00001378;
  int in_stack_00001380;
  char *in_stack_00001388;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  
  bVar1 = is_worn(in_RDI);
  if ((bVar1) && (iVar2 = number_percent(), iVar2 < 10)) {
    dice(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    act(in_stack_ffffffffffffffe0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
        (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    act(in_stack_ffffffffffffffe0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
        (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    damage_new(in_stack_00001358,in_stack_00001350,in_stack_0000134c,in_stack_00001348,
               in_stack_00001344,(bool)in_stack_00001343,(bool)in_stack_00001342,in_stack_00001378,
               in_stack_00001380,in_stack_00001388);
  }
  return;
}

Assistant:

void fight_prog_cankerworm(OBJ_DATA *obj, CHAR_DATA *ch)
{
	int dam;

	if (!is_worn(obj))
		return;

	if (number_percent() < 10)
	{
		dam = dice((ch->level), 3);
		act("The Cankerworm leaps from your hands momentarily!", ch, 0, 0, TO_CHAR);
		act("The Cankerworm seems to leap from $n's hands momentarily!", ch, 0, 0, TO_ROOM);
		damage_new(ch, ch->fighting, dam, TYPE_UNDEFINED, DAM_SLASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "burrowing axe");
	}
}